

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_mq.c
# Opt level: O2

void skynet_mq_push(message_queue *q,skynet_message *message)

{
  undefined8 *puVar1;
  uint uVar2;
  skynet_message *psVar3;
  void *pvVar4;
  int iVar5;
  skynet_message *psVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (message != (skynet_message *)0x0) {
    spinlock_lock(&q->lock);
    psVar6 = q->queue;
    iVar8 = q->tail;
    psVar6[iVar8].sz = message->sz;
    iVar5 = message->session;
    pvVar4 = message->data;
    psVar6 = psVar6 + iVar8;
    psVar6->source = message->source;
    psVar6->session = iVar5;
    psVar6->data = pvVar4;
    uVar9 = q->tail + 1;
    uVar2 = q->cap;
    uVar11 = 0;
    uVar10 = (ulong)uVar9;
    if ((int)uVar2 <= (int)uVar9) {
      uVar10 = uVar11;
    }
    q->tail = (int)uVar10;
    if (q->head == (int)uVar10) {
      psVar6 = (skynet_message *)malloc((long)(int)uVar2 * 0x30);
      uVar7 = 0;
      if (0 < (int)uVar2) {
        uVar7 = (ulong)uVar2;
      }
      for (; uVar7 * 0x18 - uVar11 != 0; uVar11 = uVar11 + 0x18) {
        psVar3 = q->queue;
        iVar8 = (int)uVar10 % (int)uVar2;
        *(size_t *)((long)&psVar6->sz + uVar11) = psVar3[iVar8].sz;
        psVar3 = psVar3 + iVar8;
        pvVar4 = psVar3->data;
        puVar1 = (undefined8 *)((long)&psVar6->source + uVar11);
        *puVar1 = *(undefined8 *)psVar3;
        puVar1[1] = pvVar4;
        uVar10 = (ulong)((int)uVar10 + 1);
      }
      q->head = 0;
      q->tail = uVar2;
      q->cap = uVar2 * 2;
      free(q->queue);
      q->queue = psVar6;
    }
    if (q->in_global == 0) {
      q->in_global = 1;
      skynet_globalmq_push(q);
    }
    (q->lock).lock = 0;
    return;
  }
  __assert_fail("message",
                "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_mq.c"
                ,0xbf,"void skynet_mq_push(struct message_queue *, struct skynet_message *)");
}

Assistant:

void 
skynet_mq_push(struct message_queue *q, struct skynet_message *message) {
	assert(message);
	SPIN_LOCK(q)

	q->queue[q->tail] = *message;
	if (++ q->tail >= q->cap) {
		q->tail = 0;
	}

	if (q->head == q->tail) {
		expand_queue(q);
	}

	if (q->in_global == 0) {
		q->in_global = MQ_IN_GLOBAL;
		skynet_globalmq_push(q);
	}
	
	SPIN_UNLOCK(q)
}